

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O2

void __thiscall arm::ConstValue::~ConstValue(ConstValue *this)

{
  std::__detail::__variant::
  _Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&this->field_0x8);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~ConstValue() {}